

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

void __thiscall pbrt::ImageTileIntegrator::Render(ImageTileIntegrator *this)

{
  Allocator alloc;
  Allocator alloc_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view str;
  value_type vVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  size_type sVar6;
  reference pvVar7;
  Bounds2<int> *pBVar8;
  Image *pIVar9;
  Tuple2<pbrt::Vector2,_int> alloc_01;
  Tuple2<pbrt::Vector2,_int> this_00;
  char *__filename;
  int *piVar10;
  long *in_RDI;
  long in_FS_OFFSET;
  ImageChannelValues mse_1;
  Image filmImage;
  ImageMetadata filmMetadata;
  ImageMetadata metadata;
  FilmHandle film;
  Point2i vb;
  Point2i va;
  Bounds2i cropBounds;
  Bounds2i msePixelBounds;
  ImageAndMetadata mse;
  FILE *mseOutFile;
  optional<pbrt::Image> referenceImage;
  int nextWaveSize;
  int waveEnd;
  int waveStart;
  ProgressReporter progress;
  int spp;
  Bounds2i pixelBounds;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> samplers;
  int i;
  vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> scratchBuffers;
  CheckCallbackScope _;
  SamplerHandle tileSampler;
  ScratchBuffer scratchBuffer;
  int sampleIndex;
  Point2i pPixel;
  optional<std::vector<int,_std::allocator<int>_>_> c;
  Image *in_stack_fffffffffffff000;
  ImageAndMetadata *in_stack_fffffffffffff008;
  ImageMetadata *in_stack_fffffffffffff010;
  int iVar11;
  ScratchBuffer *in_stack_fffffffffffff018;
  undefined4 in_stack_fffffffffffff020;
  Float in_stack_fffffffffffff024;
  ImageMetadata *in_stack_fffffffffffff028;
  undefined6 in_stack_fffffffffffff030;
  undefined1 in_stack_fffffffffffff036;
  undefined1 in_stack_fffffffffffff037;
  string *in_stack_fffffffffffff038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff040;
  int in_stack_fffffffffffff048;
  int in_stack_fffffffffffff04c;
  undefined4 in_stack_fffffffffffff050;
  Float in_stack_fffffffffffff054;
  ImageMetadata *in_stack_fffffffffffff058;
  uint in_stack_fffffffffffff060;
  Float in_stack_fffffffffffff064;
  Image *in_stack_fffffffffffff068;
  undefined7 in_stack_fffffffffffff070;
  undefined1 in_stack_fffffffffffff077;
  undefined8 in_stack_fffffffffffff078;
  LogLevel level;
  undefined7 in_stack_fffffffffffff088;
  undefined1 in_stack_fffffffffffff08f;
  Point2<int> *in_stack_fffffffffffff090;
  undefined4 in_stack_fffffffffffff098;
  int in_stack_fffffffffffff09c;
  Point2<int> *in_stack_fffffffffffff0a0;
  LogLevel in_stack_fffffffffffff0ac;
  undefined7 in_stack_fffffffffffff0b0;
  char in_stack_fffffffffffff0b7;
  size_t in_stack_fffffffffffff0b8;
  char *in_stack_fffffffffffff0c0;
  string *local_f30;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *in_stack_fffffffffffff0f0;
  Bounds2i *in_stack_fffffffffffff0f8;
  Point2i *resolution;
  string *title;
  Image *in_stack_fffffffffffff3f8;
  Image *in_stack_fffffffffffff400;
  ImageChannelDesc *in_stack_fffffffffffff408;
  Image *in_stack_fffffffffffff410;
  int local_924;
  int local_920;
  int local_91c;
  undefined1 *local_918;
  undefined1 *local_910;
  uint *local_908;
  uint *local_900;
  undefined1 *local_8f0;
  Bounds2i local_8c0;
  undefined1 local_88c;
  allocator<char> local_88b;
  undefined1 local_88a;
  undefined1 local_889 [9];
  Point2i local_880 [4];
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> local_860;
  undefined1 local_840 [32];
  Point2i *local_820;
  undefined8 local_818;
  Tuple2<pbrt::Vector2,_int> local_7f8;
  string local_7e8 [72];
  Tuple2<pbrt::Vector2,_int> local_7a0;
  Point2<int> local_798;
  Tuple2<pbrt::Point2,_int> local_790 [37];
  Tuple2<pbrt::Vector2,_int> local_668;
  Tuple2<pbrt::Vector2,_int> local_658;
  Tuple2<pbrt::Point2,_int> local_638;
  Bounds2<int> local_628 [12];
  ColorEncodingHandle *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffaa8;
  Allocator in_stack_fffffffffffffab0;
  optional local_460 [112];
  ImageMetadata *local_3f0;
  optional<pbrt::Image> local_3e8;
  string local_2c0 [32];
  string local_2a0 [32];
  int local_280;
  uint local_27c;
  uint local_278;
  allocator<char> local_271;
  string local_270 [32];
  undefined1 local_250 [84];
  int local_1fc [3];
  Bounds2i local_1f0;
  undefined1 local_1d8 [92];
  int local_17c;
  undefined1 local_178 [72];
  undefined1 local_130 [16];
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> local_120;
  undefined1 local_100 [96];
  value_type local_a0;
  undefined1 local_9c [20];
  undefined1 local_88 [16];
  optional local_78 [112];
  
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_88 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(Options + 0x88));
    iVar11 = (int)((ulong)in_stack_fffffffffffff010 >> 0x20);
    str._M_str = in_stack_fffffffffffff0c0;
    str._M_len = in_stack_fffffffffffff0b8;
    SplitStringToInts(str,in_stack_fffffffffffff0b7);
    bVar2 = pstd::optional::operator_cast_to_bool(local_78);
    if (!bVar2) {
      ErrorExit<std::__cxx11::string&>
                ((char *)in_stack_fffffffffffff038,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff037,
                          CONCAT16(in_stack_fffffffffffff036,in_stack_fffffffffffff030)));
    }
    pvVar5 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator->
                       ((optional<std::vector<int,_std::allocator<int>_>_> *)0x795e9d);
    sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
    if (sVar6 != 3) {
      ErrorExit<std::__cxx11::string&>
                ((char *)in_stack_fffffffffffff038,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff037,
                          CONCAT16(in_stack_fffffffffffff036,in_stack_fffffffffffff030)));
    }
    pvVar5 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                       ((optional<std::vector<int,_std::allocator<int>_>_> *)0x795ee6);
    std::vector<int,_std::allocator<int>_>::operator[](pvVar5,0);
    pvVar5 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                       ((optional<std::vector<int,_std::allocator<int>_>_> *)0x795f17);
    std::vector<int,_std::allocator<int>_>::operator[](pvVar5,1);
    Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff008,
                        (int)((ulong)in_stack_fffffffffffff000 >> 0x20),
                        (int)in_stack_fffffffffffff000);
    pvVar5 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::operator*
                       ((optional<std::vector<int,_std::allocator<int>_>_> *)0x795f58);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,2);
    local_a0 = *pvVar7;
    ScratchBuffer::ScratchBuffer(in_stack_fffffffffffff018,iVar11);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff008);
    alloc.memoryResource._6_1_ = in_stack_fffffffffffff036;
    alloc.memoryResource._0_6_ = in_stack_fffffffffffff030;
    alloc.memoryResource._7_1_ = in_stack_fffffffffffff037;
    SamplerHandle::Clone
              ((SamplerHandle *)in_stack_fffffffffffff028,(int)in_stack_fffffffffffff024,alloc);
    std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::operator[](&local_120,0)
    ;
    SamplerHandle::SamplerHandle
              ((SamplerHandle *)in_stack_fffffffffffff008,(SamplerHandle *)in_stack_fffffffffffff000
              );
    std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::~vector
              ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
               in_stack_fffffffffffff018);
    SamplerHandle::StartPixelSample
              ((SamplerHandle *)in_stack_fffffffffffff058,
               (Point2i *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
               in_stack_fffffffffffff04c,in_stack_fffffffffffff048);
    vVar1 = local_a0;
    SamplerHandle::SamplerHandle
              ((SamplerHandle *)in_stack_fffffffffffff008,(SamplerHandle *)in_stack_fffffffffffff000
              );
    (**(code **)(*in_RDI + 0x20))(in_RDI,local_9c,vVar1,local_130,local_100);
    ScratchBuffer::~ScratchBuffer(in_stack_fffffffffffff018);
    pstd::optional<std::vector<int,_std::allocator<int>_>_>::~optional
              ((optional<std::vector<int,_std::allocator<int>_>_> *)0x796097);
  }
  else {
    if (*(char *)(in_FS_OFFSET + -0x2e8) == '\0') {
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff008);
      *(undefined1 *)(in_FS_OFFSET + -0x2e8) = 1;
    }
    std::function<std::__cxx11::string()>::function<pbrt::ImageTileIntegrator::Render()::__0,void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff018,(anon_class_1_0_00000001 *)in_stack_fffffffffffff010);
    CheckCallbackScope::CheckCallbackScope
              ((CheckCallbackScope *)in_stack_fffffffffffff008,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff000);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)0x79615d);
    std::vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>::vector
              ((vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> *)0x79616a);
    local_17c = 0;
    while( true ) {
      iVar11 = local_17c;
      iVar3 = MaxThreadIndex();
      level = (LogLevel)((ulong)in_stack_fffffffffffff078 >> 0x20);
      if (iVar3 <= iVar11) break;
      ScratchBuffer::ScratchBuffer
                (in_stack_fffffffffffff018,(int)((ulong)in_stack_fffffffffffff010 >> 0x20));
      std::vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>::push_back
                ((vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> *)
                 in_stack_fffffffffffff008,(value_type *)in_stack_fffffffffffff000);
      ScratchBuffer::~ScratchBuffer(in_stack_fffffffffffff018);
      local_17c = local_17c + 1;
    }
    MaxThreadIndex();
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff008);
    alloc_00.memoryResource._6_1_ = in_stack_fffffffffffff036;
    alloc_00.memoryResource._0_6_ = in_stack_fffffffffffff030;
    alloc_00.memoryResource._7_1_ = in_stack_fffffffffffff037;
    SamplerHandle::Clone
              ((SamplerHandle *)in_stack_fffffffffffff028,(int)in_stack_fffffffffffff024,alloc_00);
    CameraHandle::GetFilm((CameraHandle *)in_stack_fffffffffffff010);
    local_1f0 = FilmHandle::PixelBounds((FilmHandle *)in_stack_fffffffffffff008);
    local_1fc[0] = SamplerHandle::SamplesPerPixel((SamplerHandle *)in_stack_fffffffffffff008);
    Bounds2<int>::Area((Bounds2<int> *)in_stack_fffffffffffff008);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048),
               (char *)in_stack_fffffffffffff040,(allocator<char> *)in_stack_fffffffffffff038);
    ProgressReporter::ProgressReporter
              ((ProgressReporter *)CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048),
               (int64_t)in_stack_fffffffffffff040,in_stack_fffffffffffff038,
               (bool)in_stack_fffffffffffff037,(bool)in_stack_fffffffffffff036);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator(&local_271);
    local_278 = 0;
    local_27c = 1;
    local_280 = 1;
    if ((*(byte *)(Options + 10) & 1) != 0) {
      CameraHandle::GetFilm((CameraHandle *)in_stack_fffffffffffff010);
      FilmHandle::GetFilename_abi_cxx11_((FilmHandle *)in_stack_fffffffffffff010);
      RemoveExtension((string *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0));
      StatsEnablePixelStats
                ((Bounds2i *)in_stack_fffffffffffff008,(string *)in_stack_fffffffffffff000);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_2c0);
    }
    pstd::optional<pbrt::Image>::optional(&local_3e8);
    local_3f0 = (ImageMetadata *)0x0;
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff008);
      ColorEncodingHandle::TaggedPointer
                ((ColorEncodingHandle *)in_stack_fffffffffffff008,in_stack_fffffffffffff000);
      Image::Read(in_stack_fffffffffffffaa8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaa0);
      pstd::optional<pbrt::Image>::operator=
                ((optional<pbrt::Image> *)in_stack_fffffffffffff008,in_stack_fffffffffffff000);
      bVar2 = pstd::optional::operator_cast_to_bool(local_460);
      if (bVar2) {
        pBVar8 = pstd::optional<pbrt::Bounds2<int>_>::operator*
                           ((optional<pbrt::Bounds2<int>_> *)0x796642);
        local_628[0].pMin.super_Tuple2<pbrt::Point2,_int> =
             (pBVar8->pMin).super_Tuple2<pbrt::Point2,_int>;
        local_628[0].pMax.super_Tuple2<pbrt::Point2,_int> =
             (pBVar8->pMax).super_Tuple2<pbrt::Point2,_int>;
      }
      else {
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff008,
                            (int)((ulong)in_stack_fffffffffffff000 >> 0x20),
                            (int)in_stack_fffffffffffff000);
        pIVar9 = pstd::optional<pbrt::Image>::operator->((optional<pbrt::Image> *)0x79668d);
        local_638 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(pIVar9);
        Bounds2<int>::Bounds2
                  ((Bounds2<int> *)in_stack_fffffffffffff018,
                   (Point2<int> *)in_stack_fffffffffffff010,(Point2<int> *)in_stack_fffffffffffff008
                  );
      }
      bVar2 = Inside<int>(&local_1f0,local_628);
      if (!bVar2) {
        ErrorExit<pbrt::Bounds2<int>&,pbrt::Bounds2<int>&>
                  ((char *)CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048),
                   (Bounds2<int> *)in_stack_fffffffffffff040,
                   (Bounds2<int> *)in_stack_fffffffffffff038);
      }
      alloc_01 = (Tuple2<pbrt::Vector2,_int>)
                 Point2<int>::operator-
                           ((Point2<int> *)in_stack_fffffffffffff000,(Point2<int> *)0x79676f);
      local_658 = alloc_01;
      Point2<int>::Point2<int>
                ((Point2<int> *)in_stack_fffffffffffff008,(Vector2<int> *)in_stack_fffffffffffff000)
      ;
      this_00 = (Tuple2<pbrt::Vector2,_int>)
                Point2<int>::operator-
                          ((Point2<int> *)in_stack_fffffffffffff000,(Point2<int> *)0x7967b5);
      local_668 = this_00;
      Point2<int>::Point2<int>
                ((Point2<int> *)in_stack_fffffffffffff008,(Vector2<int> *)in_stack_fffffffffffff000)
      ;
      Bounds2<int>::Bounds2
                ((Bounds2<int> *)in_stack_fffffffffffff018,(Point2<int> *)in_stack_fffffffffffff010,
                 (Point2<int> *)in_stack_fffffffffffff008);
      pIVar9 = pstd::optional<pbrt::Image>::operator->((optional<pbrt::Image> *)0x796812);
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff008);
      Image::Crop((Image *)this_00,(Bounds2i *)pIVar9,(Allocator)alloc_01);
      pstd::optional<pbrt::Image>::operator*((optional<pbrt::Image> *)0x79685d);
      Image::operator=(&in_stack_fffffffffffff008->image,in_stack_fffffffffffff000);
      Image::~Image(&in_stack_fffffffffffff008->image);
      pIVar9 = pstd::optional<pbrt::Image>::operator->((optional<pbrt::Image> *)0x796898);
      local_790[0] = (Tuple2<pbrt::Point2,_int>)Image::Resolution(pIVar9);
      local_7a0 = (Tuple2<pbrt::Vector2,_int>)
                  Bounds2<int>::Diagonal((Bounds2<int> *)in_stack_fffffffffffff000);
      Point2<int>::Point2<int>
                ((Point2<int> *)in_stack_fffffffffffff008,(Vector2<int> *)in_stack_fffffffffffff000)
      ;
      bVar2 = Tuple2<pbrt::Point2,_int>::operator==(local_790,&local_798);
      if (!bVar2) {
        LogFatal<char_const(&)[29],char_const(&)[32],char_const(&)[29],pbrt::Point2<int>&,char_const(&)[32],pbrt::Point2<int>&>
                  (level,(char *)CONCAT17(in_stack_fffffffffffff077,in_stack_fffffffffffff070),
                   (int)((ulong)in_stack_fffffffffffff068 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),
                   (char (*) [29])in_stack_fffffffffffff058,
                   (char (*) [32])CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                   (char (*) [29])CONCAT17(in_stack_fffffffffffff08f,in_stack_fffffffffffff088),
                   in_stack_fffffffffffff090,
                   (char (*) [32])CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                   in_stack_fffffffffffff0a0);
      }
      __filename = (char *)std::__cxx11::string::c_str();
      local_3f0 = (ImageMetadata *)fopen(__filename,"w");
      if (local_3f0 == (ImageMetadata *)0x0) {
        LastError();
        ErrorString_abi_cxx11_((int)((ulong)in_stack_fffffffffffff010 >> 0x20));
        ErrorExit<std::__cxx11::string&,std::__cxx11::string>
                  ((char *)CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048),
                   in_stack_fffffffffffff040,in_stack_fffffffffffff038);
      }
      ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff008);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      CameraHandle::GetFilm((CameraHandle *)in_stack_fffffffffffff010);
      FilmHandle::GetFilename_abi_cxx11_((FilmHandle *)in_stack_fffffffffffff010);
      local_7f8 = (Tuple2<pbrt::Vector2,_int>)
                  Bounds2<int>::Diagonal((Bounds2<int> *)in_stack_fffffffffffff000);
      Point2<int>::Point2<int>
                ((Point2<int> *)in_stack_fffffffffffff008,(Vector2<int> *)in_stack_fffffffffffff000)
      ;
      local_88c = 1;
      resolution = local_880;
      title = (string *)local_889;
      local_889._1_8_ = resolution;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048),
                 (char *)in_stack_fffffffffffff040,(allocator<char> *)in_stack_fffffffffffff038);
      in_stack_fffffffffffff0f0 = &local_860;
      in_stack_fffffffffffff0f8 = (Bounds2i *)&local_88a;
      local_889._1_8_ = in_stack_fffffffffffff0f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048),
                 (char *)in_stack_fffffffffffff040,(allocator<char> *)in_stack_fffffffffffff038);
      local_889._1_8_ = local_840;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048),
                 (char *)in_stack_fffffffffffff040,(allocator<char> *)in_stack_fffffffffffff038);
      local_88c = 0;
      local_820 = local_880;
      local_818 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x796c3e);
      __l._M_len._0_4_ = in_stack_fffffffffffff048;
      __l._M_array = in_stack_fffffffffffff040;
      __l._M_len._4_4_ = in_stack_fffffffffffff04c;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff038,__l,
               (allocator_type *)
               CONCAT17(in_stack_fffffffffffff037,
                        CONCAT16(in_stack_fffffffffffff036,in_stack_fffffffffffff030)));
      FilmHandle::FilmHandle
                ((FilmHandle *)in_stack_fffffffffffff008,(FilmHandle *)in_stack_fffffffffffff000);
      local_8c0 = local_1f0;
      std::function<void(pbrt::Bounds2<int>,pstd::span<pstd::span<float>>)>::
      function<pbrt::ImageTileIntegrator::Render()::__1,void>
                ((function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)
                 in_stack_fffffffffffff018,(anon_class_24_2_c7be04e2 *)in_stack_fffffffffffff010);
      DisplayDynamic(title,resolution,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff0f8,in_stack_fffffffffffff0f0);
      std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::~function
                ((function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)0x796cd9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff018);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x796cf3);
      local_f30 = (string *)&local_820;
      do {
        local_f30 = local_f30 + -0x20;
        std::__cxx11::string::~string(local_f30);
      } while (local_f30 != (string *)local_880);
      std::allocator<char>::~allocator(&local_88b);
      std::allocator<char>::~allocator((allocator<char> *)&local_88a);
      std::allocator<char>::~allocator((allocator<char> *)local_889);
      std::__cxx11::string::~string(local_7e8);
    }
    while ((int)local_278 < local_1fc[0]) {
      local_918 = local_178;
      local_910 = local_1d8;
      local_908 = &local_278;
      local_900 = &local_27c;
      local_8f0 = local_250;
      std::function<void(pbrt::Bounds2<int>)>::
      function<pbrt::ImageTileIntegrator::Render()::__2,void>
                ((function<void_(pbrt::Bounds2<int>)> *)in_stack_fffffffffffff018,
                 (anon_class_48_6_c884ba13 *)in_stack_fffffffffffff010);
      ParallelFor2D(in_stack_fffffffffffff0f8,
                    (function<void_(pbrt::Bounds2<int>)> *)in_stack_fffffffffffff0f0);
      std::function<void_(pbrt::Bounds2<int>)>::~function
                ((function<void_(pbrt::Bounds2<int>)> *)0x796fea);
      local_278 = local_27c;
      local_91c = local_27c + local_280;
      in_stack_fffffffffffff090 = (Point2<int> *)std::min<int>(local_1fc,&local_91c);
      local_27c = (in_stack_fffffffffffff090->super_Tuple2<pbrt::Point2,_int>).x;
      bVar2 = pstd::optional::operator_cast_to_bool((optional *)&local_3e8);
      if (!bVar2) {
        local_920 = local_280 * 2;
        local_924 = 0x40;
        piVar10 = std::min<int>(&local_920,&local_924);
        local_280 = *piVar10;
      }
      if (LOGGING_LogLevel < 1) {
        Log<int&>((LogLevel)((ulong)in_stack_fffffffffffff068 >> 0x20),
                  (char *)CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),
                  (int)((ulong)in_stack_fffffffffffff058 >> 0x20),
                  (char *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                  (int *)CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048));
      }
      ImageMetadata::ImageMetadata((ImageMetadata *)in_stack_fffffffffffff008);
      ProgressReporter::ElapsedSeconds((ProgressReporter *)0x797122);
      pstd::optional<float>::operator=
                ((optional<float> *)in_stack_fffffffffffff008,(float *)in_stack_fffffffffffff000);
      pstd::optional<int>::operator=
                ((optional<int> *)in_stack_fffffffffffff008,(int *)in_stack_fffffffffffff000);
      bVar2 = pstd::optional::operator_cast_to_bool((optional *)&local_3e8);
      if (bVar2) {
        ImageMetadata::ImageMetadata((ImageMetadata *)in_stack_fffffffffffff008);
        CameraHandle::GetFilm((CameraHandle *)in_stack_fffffffffffff010);
        FilmHandle::GetImage
                  ((FilmHandle *)
                   CONCAT17(in_stack_fffffffffffff037,
                            CONCAT16(in_stack_fffffffffffff036,in_stack_fffffffffffff030)),
                   in_stack_fffffffffffff028,in_stack_fffffffffffff024);
        Image::AllChannelsDesc
                  ((Image *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050));
        in_stack_fffffffffffff068 =
             pstd::optional<pbrt::Image>::operator*((optional<pbrt::Image> *)0x79720b);
        Image::MSE(in_stack_fffffffffffff410,in_stack_fffffffffffff408,in_stack_fffffffffffff400,
                   in_stack_fffffffffffff3f8);
        ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x797248);
        in_stack_fffffffffffff058 = local_3f0;
        in_stack_fffffffffffff060 = local_278;
        in_stack_fffffffffffff064 =
             ImageChannelValues::Average((ImageChannelValues *)in_stack_fffffffffffff018);
        fprintf((FILE *)in_stack_fffffffffffff058,"%d, %.9g\n",(double)in_stack_fffffffffffff064,
                (ulong)in_stack_fffffffffffff060);
        in_stack_fffffffffffff054 =
             ImageChannelValues::Average((ImageChannelValues *)in_stack_fffffffffffff018);
        pstd::optional<float>::operator=
                  ((optional<float> *)in_stack_fffffffffffff008,(float *)in_stack_fffffffffffff000);
        fflush((FILE *)local_3f0);
        ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x7972ed);
        Image::~Image(&in_stack_fffffffffffff008->image);
        ImageMetadata::~ImageMetadata((ImageMetadata *)in_stack_fffffffffffff008);
      }
      CameraHandle::InitMetadata
                ((CameraHandle *)in_stack_fffffffffffff018,in_stack_fffffffffffff010);
      CameraHandle::GetFilm((CameraHandle *)in_stack_fffffffffffff010);
      ImageMetadata::ImageMetadata
                (in_stack_fffffffffffff058,
                 (ImageMetadata *)CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050));
      FilmHandle::WriteImage
                ((FilmHandle *)in_stack_fffffffffffff028,
                 (ImageMetadata *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),
                 (Float)((ulong)in_stack_fffffffffffff018 >> 0x20));
      ImageMetadata::~ImageMetadata((ImageMetadata *)in_stack_fffffffffffff008);
      ImageMetadata::~ImageMetadata((ImageMetadata *)in_stack_fffffffffffff008);
    }
    if (local_3f0 != (ImageMetadata *)0x0) {
      fclose((FILE *)local_3f0);
    }
    ProgressReporter::Done((ProgressReporter *)in_stack_fffffffffffff008);
    if (LOGGING_LogLevel < 1) {
      Log(in_stack_fffffffffffff0ac,(char *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff09c,
          (char *)in_stack_fffffffffffff090);
    }
    pstd::optional<pbrt::Image>::~optional((optional<pbrt::Image> *)0x7974e2);
    ProgressReporter::~ProgressReporter((ProgressReporter *)in_stack_fffffffffffff008);
    std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::~vector
              ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
               in_stack_fffffffffffff018);
    std::vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>::~vector
              ((vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> *)
               in_stack_fffffffffffff018);
    CheckCallbackScope::~CheckCallbackScope((CheckCallbackScope *)in_stack_fffffffffffff028);
  }
  return;
}

Assistant:

void ImageTileIntegrator::Render() {
    // Handle debugStart, if set
    if (!Options->debugStart.empty()) {
        pstd::optional<std::vector<int>> c = SplitStringToInts(Options->debugStart, ',');
        if (!c)
            ErrorExit("Didn't find integer values after --debugstart: %s",
                      Options->debugStart);
        if (c->size() != 3)
            ErrorExit("Didn't find three integer values after --debugstart: %s",
                      Options->debugStart);

        Point2i pPixel((*c)[0], (*c)[1]);
        int sampleIndex = (*c)[2];

        ScratchBuffer scratchBuffer(65536);
        SamplerHandle tileSampler = samplerPrototype.Clone(1, Allocator())[0];
        tileSampler.StartPixelSample(pPixel, sampleIndex);

        EvaluatePixelSample(pPixel, sampleIndex, tileSampler, scratchBuffer);

        return;
    }

    thread_local Point2i threadPixel;
    thread_local int threadSampleIndex;
    CheckCallbackScope _([&]() {
        return StringPrintf("Rendering failed at pixel (%d, %d) sample %d. Debug with "
                            "\"--debugstart %d,%d,%d\"\n",
                            threadPixel.x, threadPixel.y, threadSampleIndex,
                            threadPixel.x, threadPixel.y, threadSampleIndex);
    });

    // Declare common variables for rendering image in tiles
    std::vector<ScratchBuffer> scratchBuffers;
    for (int i = 0; i < MaxThreadIndex(); ++i)
        scratchBuffers.push_back(ScratchBuffer(65536));

    std::vector<SamplerHandle> samplers = samplerPrototype.Clone(MaxThreadIndex());

    Bounds2i pixelBounds = camera.GetFilm().PixelBounds();
    int spp = samplerPrototype.SamplesPerPixel();
    ProgressReporter progress(int64_t(spp) * pixelBounds.Area(), "Rendering",
                              Options->quiet);

    int waveStart = 0, waveEnd = 1, nextWaveSize = 1;

    if (Options->recordPixelStatistics)
        StatsEnablePixelStats(pixelBounds,
                              RemoveExtension(camera.GetFilm().GetFilename()));
    // Handle MSE referene image, if provided
    pstd::optional<Image> referenceImage;
    FILE *mseOutFile = nullptr;
    if (!Options->mseReferenceImage.empty()) {
        auto mse = Image::Read(Options->mseReferenceImage);
        referenceImage = mse.image;

        Bounds2i msePixelBounds =
            mse.metadata.pixelBounds
                ? *mse.metadata.pixelBounds
                : Bounds2i(Point2i(0, 0), referenceImage->Resolution());
        if (!Inside(pixelBounds, msePixelBounds))
            ErrorExit("Output image pixel bounds %s aren't inside the MSE "
                      "image's pixel bounds %s.",
                      pixelBounds, msePixelBounds);

        // Transform the pixelBounds of the image we're rendering to the
        // coordinate system with msePixelBounds.pMin at the origin, which
        // in turn gives us the section of the MSE image to crop. (This is
        // complicated by the fact that Image doesn't support pixel
        // bounds...)
        Bounds2i cropBounds(Point2i(pixelBounds.pMin - msePixelBounds.pMin),
                            Point2i(pixelBounds.pMax - msePixelBounds.pMin));
        *referenceImage = referenceImage->Crop(cropBounds);
        CHECK_EQ(referenceImage->Resolution(), Point2i(pixelBounds.Diagonal()));

        mseOutFile = fopen(Options->mseReferenceOutput.c_str(), "w");
        if (!mseOutFile)
            ErrorExit("%s: %s", Options->mseReferenceOutput, ErrorString());
    }

    // Connect to display server if needed
    if (!Options->displayServer.empty()) {
        FilmHandle film = camera.GetFilm();
        DisplayDynamic(film.GetFilename(), Point2i(pixelBounds.Diagonal()),
                       {"R", "G", "B"},
                       [=](Bounds2i b, pstd::span<pstd::span<Float>> displayValue) {
                           int index = 0;
                           for (Point2i p : b) {
                               RGB rgb = film.GetPixelRGB(pixelBounds.pMin + p);
                               for (int c = 0; c < 3; ++c)
                                   displayValue[c][index] = rgb[c];
                               ++index;
                           }
                       });
    }

    // Render image in waves
    while (waveStart < spp) {
        // Render current wave's image tiles in parallel
        ParallelFor2D(pixelBounds, [&](Bounds2i tileBounds) {
            // Render image tile given by _tileBounds_
            ScratchBuffer &scratchBuffer = scratchBuffers[ThreadIndex];
            SamplerHandle &sampler = samplers[ThreadIndex];
            PBRT_DBG("Starting image tile (%d,%d)-(%d,%d) waveStart %d, waveEnd %d\n",
                     tileBounds.pMin.x, tileBounds.pMin.y, tileBounds.pMax.x,
                     tileBounds.pMax.y, waveStart, waveEnd);
            for (Point2i pPixel : tileBounds) {
                StatsReportPixelStart(pPixel);
                threadPixel = pPixel;
                // Render samples in pixel _pPixel_
                for (int sampleIndex = waveStart; sampleIndex < waveEnd; ++sampleIndex) {
                    threadSampleIndex = sampleIndex;
                    sampler.StartPixelSample(pPixel, sampleIndex);
                    EvaluatePixelSample(pPixel, sampleIndex, sampler, scratchBuffer);
                    scratchBuffer.Reset();
                }

                StatsReportPixelEnd(pPixel);
            }
            PBRT_DBG("Finished image tile (%d,%d)-(%d,%d)\n", tileBounds.pMin.x,
                     tileBounds.pMin.y, tileBounds.pMax.x, tileBounds.pMax.y);
            progress.Update((waveEnd - waveStart) * tileBounds.Area());
        });

        // Update start and end wave
        waveStart = waveEnd;
        waveEnd = std::min(spp, waveEnd + nextWaveSize);
        if (!referenceImage)
            nextWaveSize = std::min(2 * nextWaveSize, 64);

        // Write current image to disk
        LOG_VERBOSE("Writing image with spp = %d", waveStart);
        ImageMetadata metadata;
        metadata.renderTimeSeconds = progress.ElapsedSeconds();
        metadata.samplesPerPixel = waveStart;
        if (referenceImage) {
            ImageMetadata filmMetadata;
            Image filmImage = camera.GetFilm().GetImage(&filmMetadata, 1.f / waveStart);
            ImageChannelValues mse =
                filmImage.MSE(filmImage.AllChannelsDesc(), *referenceImage);
            fprintf(mseOutFile, "%d, %.9g\n", waveStart, mse.Average());
            metadata.MSE = mse.Average();
            fflush(mseOutFile);
        }
        camera.InitMetadata(&metadata);
        camera.GetFilm().WriteImage(metadata, 1.0f / waveStart);
    }

    if (mseOutFile)
        fclose(mseOutFile);
    progress.Done();
    LOG_VERBOSE("Rendering finished");
}